

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::to_string(string *__return_storage_ptr__,CustomDataType *custom)

{
  allocator local_39;
  string local_38;
  CustomDataType *local_18;
  CustomDataType *custom_local;
  
  local_18 = custom;
  custom_local = (CustomDataType *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"",&local_39);
  print_customData(__return_storage_ptr__,custom,&local_38,0);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const CustomDataType &custom) {
  return print_customData(custom, "", 0);
}